

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O3

char * method_name(int method)

{
  if (method < 0xc) {
    if (method == 0) {
      return "Stored";
    }
    if (method == 8) {
      return "Deflate";
    }
  }
  else {
    if (method == 0xc) {
      return "BZip2";
    }
    if (method == 0xe) {
      return "LZMA";
    }
    if (method == 0x62) {
      return "PPMd";
    }
  }
  sprintf(method_name::unkn,"Unk:%03d");
  return method_name::unkn;
}

Assistant:

const char *method_name(int method)
{
	static char unkn[16];

	if (method == METHOD_STORED)
	{
		return "Stored";
	}
	if (method == METHOD_DEFLATE)
	{
		return "Deflate";
	}
	if (method == METHOD_LZMA)
	{
		return "LZMA";
	}
	if (method == METHOD_PPMD)
	{
		return "PPMd";
	}
	if (method == METHOD_BZIP2)
	{
		return "BZip2";
	}
	sprintf(unkn, "Unk:%03d", method);
	return unkn;
}